

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner2.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::IGXMLScanner::scanRawAttrListforNameSpaces(IGXMLScanner *this,XMLSize_t attCount)

{
  short *psVar1;
  short *psVar2;
  XMLCh XVar3;
  XMLCh XVar4;
  ushort uVar5;
  XMLValidator *pXVar6;
  undefined2 *puVar7;
  SchemaValidator *pSVar8;
  XMLBufferMgr *pXVar9;
  undefined1 uVar10;
  int iVar11;
  uint uVar12;
  KVStringPair *pKVar13;
  XMLCh *pXVar14;
  XMLCh *pXVar15;
  XMLCh *pXVar16;
  Grammar *pGVar17;
  undefined4 extraout_var;
  undefined8 *puVar18;
  ReaderMgr *this_00;
  XMLBuffer *pXVar19;
  ulong uVar20;
  XMLCh *pXVar21;
  XMLSize_t XVar22;
  DatatypeValidator *pDVar23;
  long lVar24;
  ushort *puVar25;
  XMLSize_t index;
  XMLSize_t XVar26;
  int colonPos;
  RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> i;
  int local_a4;
  XMLBufferMgr *local_a0;
  XMLSize_t local_98;
  uint local_8c;
  XMLBuffer *local_88;
  XMLBuffer *local_80;
  long local_78;
  XMLCh *local_70;
  XMLCh *local_68;
  undefined1 local_60 [16];
  RefHashTableBucketElem<xercesc_4_0::Grammar> *local_50;
  XMLSize_t local_48;
  RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *local_40;
  
  local_98 = attCount;
  if (attCount != 0) {
    XVar26 = 0;
    do {
      pKVar13 = BaseRefVectorOf<xercesc_4_0::KVStringPair>::elementAt
                          (&this->fRawAttrList->super_BaseRefVectorOf<xercesc_4_0::KVStringPair>,
                           XVar26);
      pXVar15 = pKVar13->fKey;
      iVar11 = XMLString::compareNString(pXVar15,L"xmlns:",6);
      if ((pXVar15 == L"xmlns") || (iVar11 == 0)) {
LAB_002a662e:
        pXVar14 = pKVar13->fValue;
        updateNSMap(this,pXVar15,pXVar14,this->fRawAttrColonList[XVar26]);
        if (pXVar14 == L"http://www.w3.org/2001/XMLSchema-instance") {
LAB_002a667c:
          this->fSeeXsi = true;
        }
        else {
          pXVar15 = L"http://www.w3.org/2001/XMLSchema-instance";
          if (pXVar14 == (XMLCh *)0x0) {
LAB_002a6676:
            if (*pXVar15 == L'\0') goto LAB_002a667c;
          }
          else {
            pXVar15 = L"http://www.w3.org/2001/XMLSchema-instance";
            do {
              XVar3 = *pXVar14;
              if (XVar3 == L'\0') goto LAB_002a6676;
              pXVar14 = pXVar14 + 1;
              XVar4 = *pXVar15;
              pXVar15 = pXVar15 + 1;
            } while (XVar3 == XVar4);
          }
        }
      }
      else {
        pXVar14 = L"xmlns";
        if (pXVar15 == (XMLCh *)0x0) {
LAB_002a6628:
          if (*pXVar14 == L'\0') goto LAB_002a662e;
        }
        else {
          pXVar14 = L"xmlns";
          pXVar16 = pXVar15;
          do {
            XVar3 = *pXVar16;
            if (XVar3 == L'\0') goto LAB_002a6628;
            pXVar16 = pXVar16 + 1;
            XVar4 = *pXVar14;
            pXVar14 = pXVar14 + 1;
          } while (XVar3 == XVar4);
        }
      }
      XVar26 = XVar26 + 1;
    } while (XVar26 != local_98);
  }
  if ((((this->super_XMLScanner).fDoSchema == true) && (local_98 != 0)) &&
     ((this->fSeeXsi & 1U) != 0)) {
    local_88 = &(this->super_XMLScanner).fURIBuf;
    XVar26 = 0;
    do {
      pKVar13 = BaseRefVectorOf<xercesc_4_0::KVStringPair>::elementAt
                          (&this->fRawAttrList->super_BaseRefVectorOf<xercesc_4_0::KVStringPair>,
                           XVar26);
      pXVar15 = pKVar13->fKey;
      XVar22 = (XMLSize_t)this->fRawAttrColonList[XVar26];
      pXVar14 = L"";
      if (XVar22 != 0xffffffffffffffff) {
        (this->super_XMLScanner).fURIBuf.fIndex = 0;
        XMLBuffer::append(local_88,pXVar15,XVar22);
        pXVar14 = (this->super_XMLScanner).fURIBuf.fBuffer;
        pXVar14[(this->super_XMLScanner).fURIBuf.fIndex] = L'\0';
      }
      uVar12 = XMLScanner::resolvePrefix(&this->super_XMLScanner,pXVar14,Mode_Attribute);
      if (uVar12 == (this->super_XMLScanner).fSchemaNamespaceId) {
        pXVar15 = pXVar15 + XVar22 + 1;
        if (pXVar15 == L"schemaLocation") {
LAB_002a67b9:
          parseSchemaLocation(this,pKVar13->fValue,false);
        }
        else {
          pXVar14 = L"schemaLocation";
          if (pXVar15 == (XMLCh *)0x0) {
LAB_002a677d:
            if (*pXVar14 == L'\0') goto LAB_002a67b9;
          }
          else {
            pXVar14 = L"schemaLocation";
            pXVar16 = pXVar15;
            do {
              XVar3 = *pXVar16;
              if (XVar3 == L'\0') goto LAB_002a677d;
              pXVar16 = pXVar16 + 1;
              XVar4 = *pXVar14;
              pXVar14 = pXVar14 + 1;
            } while (XVar3 == XVar4);
          }
          if (pXVar15 == L"noNamespaceSchemaLocation") {
LAB_002a67cb:
            resolveSchemaGrammar(this,pKVar13->fValue,L"",false);
          }
          else {
            pXVar14 = L"noNamespaceSchemaLocation";
            if (pXVar15 == (XMLCh *)0x0) {
LAB_002a67c5:
              if (*pXVar14 == L'\0') goto LAB_002a67cb;
            }
            else {
              pXVar14 = L"noNamespaceSchemaLocation";
              do {
                XVar3 = *pXVar15;
                if (XVar3 == L'\0') goto LAB_002a67c5;
                pXVar15 = pXVar15 + 1;
                XVar4 = *pXVar14;
                pXVar14 = pXVar14 + 1;
              } while (XVar3 == XVar4);
            }
          }
        }
      }
      XVar26 = XVar26 + 1;
    } while (XVar26 != local_98);
    local_a0 = &(this->super_XMLScanner).fBufMgr;
    local_80 = &(this->super_XMLScanner).fPrefixBuf;
    XVar26 = 0;
    do {
      pKVar13 = BaseRefVectorOf<xercesc_4_0::KVStringPair>::elementAt
                          (&this->fRawAttrList->super_BaseRefVectorOf<xercesc_4_0::KVStringPair>,
                           XVar26);
      pXVar15 = pKVar13->fKey;
      XVar22 = (XMLSize_t)this->fRawAttrColonList[XVar26];
      pXVar14 = L"";
      if (XVar22 != 0xffffffffffffffff) {
        (this->super_XMLScanner).fURIBuf.fIndex = 0;
        XMLBuffer::append(local_88,pXVar15,XVar22);
        pXVar14 = (this->super_XMLScanner).fURIBuf.fBuffer;
        pXVar14[(this->super_XMLScanner).fURIBuf.fIndex] = L'\0';
      }
      uVar12 = XMLScanner::resolvePrefix(&this->super_XMLScanner,pXVar14,Mode_Attribute);
      if (uVar12 != (this->super_XMLScanner).fSchemaNamespaceId) goto LAB_002a6dea;
      pXVar14 = pKVar13->fValue;
      pXVar15 = pXVar15 + XVar22 + 1;
      if (pXVar15 == L"type") {
LAB_002a691d:
        pXVar6 = (this->super_XMLScanner).fValidator;
        if ((pXVar6 == (XMLValidator *)0x0) ||
           (iVar11 = (*pXVar6->_vptr_XMLValidator[0xd])(), (char)iVar11 == '\0')) {
          (*((this->super_XMLScanner).fGrammarResolver)->fGrammarPool->_vptr_XMLGrammarPool[5])
                    ((RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *)
                     local_60);
          do {
            if ((local_50 == (RefHashTableBucketElem<xercesc_4_0::Grammar> *)0x0) &&
               (local_48 == local_40->fHashModulus)) goto LAB_002a698c;
            pGVar17 = RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::
                      nextElement((RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>
                                   *)local_60);
            iVar11 = (*(pGVar17->super_XSerializable)._vptr_XSerializable[5])(pGVar17);
          } while (iVar11 != 1);
          iVar11 = (*(pGVar17->super_XSerializable)._vptr_XSerializable[6])(pGVar17);
          switchGrammar(this,(XMLCh *)CONCAT44(extraout_var,iVar11));
LAB_002a698c:
          RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::
          ~RefHashTableOfEnumerator
                    ((RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *)
                     local_60);
        }
        pXVar6 = (this->super_XMLScanner).fValidator;
        if ((pXVar6 != (XMLValidator *)0x0) &&
           (iVar11 = (*pXVar6->_vptr_XMLValidator[0xd])(), pXVar9 = local_a0, (char)iVar11 != '\0'))
        {
          if (pXVar15 == L"type") {
LAB_002a6a37:
            pXVar19 = XMLBufferMgr::bidOnBuffer(local_a0);
            local_60._8_8_ = pXVar9;
            uVar20 = 0x51;
            uVar5 = 0x4e;
            puVar25 = &DAT_00368cac;
            do {
              uVar20 = (ulong)uVar5 + (uVar20 >> 0x18) + uVar20 * 0x26;
              uVar5 = *puVar25;
              puVar25 = puVar25 + 1;
            } while (uVar5 != 0);
            for (puVar18 = *(undefined8 **)
                            (*(long *)(DatatypeValidatorFactory::fBuiltInRegistry + 0x10) +
                            (uVar20 % *(ulong *)(DatatypeValidatorFactory::fBuiltInRegistry + 0x18))
                            * 8); puVar18 != (undefined8 *)0x0; puVar18 = (undefined8 *)puVar18[1])
            {
              puVar7 = (undefined2 *)puVar18[2];
              if (puVar7 == &SchemaSymbols::fgDT_QNAME) {
LAB_002a6af7:
                pDVar23 = (DatatypeValidator *)*puVar18;
                goto LAB_002a6afa;
              }
              if (puVar7 != (undefined2 *)0x0) {
                lVar24 = 0;
                do {
                  psVar1 = (short *)((long)&SchemaSymbols::fgDT_QNAME + lVar24);
                  if (*psVar1 == 0) {
                    if (*(short *)((long)puVar7 + lVar24) == 0) goto LAB_002a6af7;
                    break;
                  }
                  psVar2 = (short *)((long)puVar7 + lVar24);
                  lVar24 = lVar24 + 2;
                } while (*psVar1 == *psVar2);
              }
            }
            pDVar23 = (DatatypeValidator *)0x0;
LAB_002a6afa:
            local_60._0_8_ = pXVar19;
            normalizeAttRawValue(this,L"type",pXVar14,pXVar19);
            pSVar8 = (SchemaValidator *)(this->super_XMLScanner).fValidator;
            pXVar15 = pXVar19->fBuffer;
            pXVar15[pXVar19->fIndex] = L'\0';
            SchemaValidator::normalizeWhiteSpace(pSVar8,pDVar23,pXVar15,pXVar19,true);
            if (pXVar19->fIndex != 0) {
              local_a4 = -1;
              pXVar15 = pXVar19->fBuffer;
              pXVar15[pXVar19->fIndex] = L'\0';
              local_8c = XMLScanner::resolveQName
                                   (&this->super_XMLScanner,pXVar15,local_80,Mode_Element,&local_a4)
              ;
              pXVar6 = (this->super_XMLScanner).fValidator;
              local_68 = (this->super_XMLScanner).fPrefixBuf.fBuffer;
              local_68[(this->super_XMLScanner).fPrefixBuf.fIndex] = L'\0';
              local_70 = pXVar19->fBuffer;
              local_70[pXVar19->fIndex] = L'\0';
              local_78 = (long)local_a4;
              if (pXVar6[1].fReaderMgr != (ReaderMgr *)0x0) {
                (*((pXVar6[1].fReaderMgr)->super_Locator)._vptr_Locator[1])();
              }
              this_00 = (ReaderMgr *)
                        XMemory::operator_new(0x48,(MemoryManager *)pXVar6[1]._vptr_XMLValidator);
              QName::QName((QName *)this_00,local_68,local_70 + local_78 + 1,local_8c,
                           (MemoryManager *)pXVar6[1]._vptr_XMLValidator);
              pXVar6[1].fReaderMgr = this_00;
            }
            XMLBufferMgr::releaseBuffer(local_a0,pXVar19);
          }
          else {
            pXVar16 = L"type";
            if (pXVar15 == (XMLCh *)0x0) {
LAB_002a69eb:
              if (*pXVar16 == L'\0') goto LAB_002a6a37;
            }
            else {
              pXVar16 = L"type";
              pXVar21 = pXVar15;
              do {
                XVar3 = *pXVar21;
                if (XVar3 == L'\0') goto LAB_002a69eb;
                pXVar21 = pXVar21 + 1;
                XVar4 = *pXVar16;
                pXVar16 = pXVar16 + 1;
              } while (XVar3 == XVar4);
            }
            if (pXVar15 == L"nil") {
LAB_002a6c22:
              pXVar19 = XMLBufferMgr::bidOnBuffer(local_a0);
              local_60._8_8_ = pXVar9;
              uVar20 = 0x62;
              uVar5 = 0x6f;
              puVar25 = &DAT_00368a34;
              do {
                uVar20 = (ulong)uVar5 + (uVar20 >> 0x18) + uVar20 * 0x26;
                uVar5 = *puVar25;
                puVar25 = puVar25 + 1;
              } while (uVar5 != 0);
              for (puVar18 = *(undefined8 **)
                              (*(long *)(DatatypeValidatorFactory::fBuiltInRegistry + 0x10) +
                              (uVar20 % *(ulong *)(DatatypeValidatorFactory::fBuiltInRegistry + 0x18
                                                  )) * 8); puVar18 != (undefined8 *)0x0;
                  puVar18 = (undefined8 *)puVar18[1]) {
                puVar7 = (undefined2 *)puVar18[2];
                if (puVar7 == &SchemaSymbols::fgDT_BOOLEAN) {
LAB_002a6cec:
                  pDVar23 = (DatatypeValidator *)*puVar18;
                  goto LAB_002a6cef;
                }
                if (puVar7 != (undefined2 *)0x0) {
                  lVar24 = 0;
                  do {
                    psVar1 = (short *)((long)&SchemaSymbols::fgDT_BOOLEAN + lVar24);
                    if (*psVar1 == 0) {
                      if (*(short *)((long)puVar7 + lVar24) == 0) goto LAB_002a6cec;
                      break;
                    }
                    psVar2 = (short *)((long)puVar7 + lVar24);
                    lVar24 = lVar24 + 2;
                  } while (*psVar1 == *psVar2);
                }
              }
              pDVar23 = (DatatypeValidator *)0x0;
LAB_002a6cef:
              local_60._0_8_ = pXVar19;
              normalizeAttRawValue(this,L"nil",pXVar14,pXVar19);
              pSVar8 = (SchemaValidator *)(this->super_XMLScanner).fValidator;
              pXVar15 = pXVar19->fBuffer;
              pXVar15[pXVar19->fIndex] = L'\0';
              SchemaValidator::normalizeWhiteSpace(pSVar8,pDVar23,pXVar15,pXVar19,true);
              pXVar15 = pXVar19->fBuffer;
              pXVar15[pXVar19->fIndex] = L'\0';
              uVar10 = 1;
              if (pXVar15 == L"true") {
LAB_002a6dcf:
                pXVar6 = (this->super_XMLScanner).fValidator;
                *(undefined1 *)&pXVar6[1].fScanner = uVar10;
                *(undefined1 *)((long)&pXVar6[1].fScanner + 1) = 1;
              }
              else {
                pXVar16 = L"true";
                if (pXVar15 == (XMLCh *)0x0) {
LAB_002a6d70:
                  if (*pXVar16 == L'\0') goto LAB_002a6dcf;
                }
                else {
                  pXVar16 = L"true";
                  pXVar21 = pXVar15;
                  do {
                    XVar3 = *pXVar21;
                    if (XVar3 == L'\0') goto LAB_002a6d70;
                    pXVar21 = pXVar21 + 1;
                    XVar4 = *pXVar16;
                    pXVar16 = pXVar16 + 1;
                  } while (XVar3 == XVar4);
                }
                if (pXVar15 == L"false") {
LAB_002a6dcd:
                  uVar10 = 0;
                  goto LAB_002a6dcf;
                }
                pXVar16 = L"false";
                if (pXVar15 == (XMLCh *)0x0) {
LAB_002a6daa:
                  if (*pXVar16 == L'\0') goto LAB_002a6dcd;
                }
                else {
                  pXVar16 = L"false";
                  pXVar21 = pXVar15;
                  do {
                    XVar3 = *pXVar21;
                    if (XVar3 == L'\0') goto LAB_002a6daa;
                    pXVar21 = pXVar21 + 1;
                    XVar4 = *pXVar16;
                    pXVar16 = pXVar16 + 1;
                  } while (XVar3 == XVar4);
                }
                XMLScanner::emitError
                          (&this->super_XMLScanner,InvalidAttValue,pXVar15,pXVar14,(XMLCh *)0x0,
                           (XMLCh *)0x0);
              }
              XMLBufferMgr::releaseBuffer(local_a0,pXVar19);
            }
            else {
              pXVar16 = L"nil";
              if (pXVar15 == (XMLCh *)0x0) {
LAB_002a6c18:
                if (*pXVar16 == L'\0') goto LAB_002a6c22;
              }
              else {
                pXVar16 = L"nil";
                do {
                  XVar3 = *pXVar15;
                  if (XVar3 == L'\0') goto LAB_002a6c18;
                  pXVar15 = pXVar15 + 1;
                  XVar4 = *pXVar16;
                  pXVar16 = pXVar16 + 1;
                } while (XVar3 == XVar4);
              }
            }
          }
        }
      }
      else {
        pXVar16 = L"type";
        if (pXVar15 != (XMLCh *)0x0) {
          pXVar16 = L"type";
          pXVar21 = pXVar15;
          do {
            XVar3 = *pXVar21;
            if (XVar3 == L'\0') goto LAB_002a68d1;
            pXVar21 = pXVar21 + 1;
            XVar4 = *pXVar16;
            pXVar16 = pXVar16 + 1;
          } while (XVar3 == XVar4);
          if (pXVar15 != L"nil") goto LAB_002a68e0;
          goto LAB_002a691d;
        }
LAB_002a68d1:
        if ((pXVar15 == L"nil") || (*pXVar16 == L'\0')) goto LAB_002a691d;
LAB_002a68e0:
        pXVar16 = L"nil";
        if (pXVar15 == (XMLCh *)0x0) {
LAB_002a6913:
          if (*pXVar16 == L'\0') goto LAB_002a691d;
        }
        else {
          pXVar16 = L"nil";
          pXVar21 = pXVar15;
          do {
            XVar3 = *pXVar21;
            if (XVar3 == L'\0') goto LAB_002a6913;
            pXVar21 = pXVar21 + 1;
            XVar4 = *pXVar16;
            pXVar16 = pXVar16 + 1;
          } while (XVar3 == XVar4);
        }
      }
LAB_002a6dea:
      XVar26 = XVar26 + 1;
    } while (XVar26 != local_98);
  }
  return;
}

Assistant:

void IGXMLScanner::scanRawAttrListforNameSpaces(XMLSize_t attCount)
{
    //  Make an initial pass through the list and find any xmlns attributes or
    //  schema attributes.
    //  When we find one, send it off to be used to update the element stack's
    //  namespace mappings.
    for (XMLSize_t index = 0; index < attCount; index++)
    {
        // each attribute has the prefix:suffix="value"
        const KVStringPair* curPair = fRawAttrList->elementAt(index);
        const XMLCh* rawPtr = curPair->getKey();

        //  If either the key begins with "xmlns:" or its just plain
        //  "xmlns", then use it to update the map.
        if (!XMLString::compareNString(rawPtr, XMLUni::fgXMLNSColonString, 6)
        ||  XMLString::equals(rawPtr, XMLUni::fgXMLNSString))
        {
            const XMLCh* valuePtr = curPair->getValue();

            updateNSMap(rawPtr, valuePtr, fRawAttrColonList[index]);

            // if the schema URI is seen in the the valuePtr, set the boolean seeXsi
            if (XMLString::equals(valuePtr, SchemaSymbols::fgURI_XSI)) {
                fSeeXsi = true;
            }
        }
    }

    // walk through the list again to deal with "xsi:...."
    if (fDoSchema && fSeeXsi)
    {
        for (XMLSize_t index = 0; index < attCount; index++)
        {
            // each attribute has the prefix:suffix="value"
            const KVStringPair* curPair = fRawAttrList->elementAt(index);
            const XMLCh* rawPtr = curPair->getKey();
            const XMLCh* prefPtr = XMLUni::fgZeroLenString;
            int   colonInd = fRawAttrColonList[index];

            if (colonInd != -1) {

                fURIBuf.set(rawPtr, colonInd);
                prefPtr = fURIBuf.getRawBuffer();
            }

            // if schema URI has been seen, scan for the schema location and uri
            // and resolve the schema grammar
            if (resolvePrefix(prefPtr, ElemStack::Mode_Attribute) == fSchemaNamespaceId) {

                const XMLCh* valuePtr = curPair->getValue();
                const XMLCh* suffPtr = &rawPtr[colonInd + 1];

                if (XMLString::equals(suffPtr, SchemaSymbols::fgXSI_SCHEMALOCATION))
                    parseSchemaLocation(valuePtr);
                else if (XMLString::equals(suffPtr, SchemaSymbols::fgXSI_NONAMESPACESCHEMALOCATION))
                    resolveSchemaGrammar(valuePtr, XMLUni::fgZeroLenString);
            }
        }

        // do it another time, as xsi:type and xsi:nill only work if the schema grammar has been already
        // loaded (JIRA XERCESC-1937)
        for (XMLSize_t index = 0; index < attCount; index++)
        {
            const KVStringPair* curPair = fRawAttrList->elementAt(index);
            const XMLCh* rawPtr = curPair->getKey();
            const XMLCh* prefPtr = XMLUni::fgZeroLenString;
            int   colonInd = fRawAttrColonList[index];

            if (colonInd != -1) {

                fURIBuf.set(rawPtr, colonInd);
                prefPtr = fURIBuf.getRawBuffer();
            }

            // scan for schema type
            if (resolvePrefix(prefPtr, ElemStack::Mode_Attribute) == fSchemaNamespaceId) {

                const XMLCh* valuePtr = curPair->getValue();
                const XMLCh*  suffPtr = &rawPtr[colonInd + 1];

                if(XMLString::equals(suffPtr, SchemaSymbols::fgXSI_TYPE) ||
                   XMLString::equals(suffPtr, SchemaSymbols::fgATT_NILL))
                {
                    if (!fValidator || !fValidator->handlesSchema())
                    {
                        // If we are in the DTD mode, try to switch to the Schema
                        // mode. For that we need to find any XML Schema grammar
                        // that we can switch to. Such a grammar can only come
                        // from the cache (if it came from the schemaLocation
                        // attribute, we would be in the Schema mode already).
                        //
                        XMLGrammarPool* pool = fGrammarResolver->getGrammarPool ();
                        RefHashTableOfEnumerator<Grammar> i = pool->getGrammarEnumerator ();

                        while (i.hasMoreElements ())
                        {
                            Grammar& gr (i.nextElement ());

                            if (gr.getGrammarType () == Grammar::SchemaGrammarType)
                            {
                                switchGrammar (gr.getTargetNamespace ());
                                break;
                            }
                        }
                    }

                    if( fValidator && fValidator->handlesSchema() )
                    {
                        if (XMLString::equals(suffPtr, SchemaSymbols::fgXSI_TYPE))
                        {
                            XMLBufBid bbXsi(&fBufMgr);
                            XMLBuffer& fXsiType = bbXsi.getBuffer();

                            // normalize the attribute according to schema whitespace facet
                            DatatypeValidator* tempDV = DatatypeValidatorFactory::getBuiltInRegistry()->get(SchemaSymbols::fgDT_QNAME);
                            normalizeAttRawValue(SchemaSymbols::fgXSI_TYPE, valuePtr, fXsiType);
                            ((SchemaValidator*) fValidator)->normalizeWhiteSpace(tempDV, fXsiType.getRawBuffer(), fXsiType, true);
                            if (!fXsiType.isEmpty()) {
                                int colonPos = -1;
                                unsigned int uriId = resolveQName (
                                      fXsiType.getRawBuffer()
                                    , fPrefixBuf
                                    , ElemStack::Mode_Element
                                    , colonPos
                                );
                                ((SchemaValidator*)fValidator)->setXsiType(fPrefixBuf.getRawBuffer(), fXsiType.getRawBuffer() + colonPos + 1, uriId);
                            }
                        }
                        else if (XMLString::equals(suffPtr, SchemaSymbols::fgATT_NILL))
                        {
                            // normalize the attribute according to schema whitespace facet
                            XMLBufBid bbXsi(&fBufMgr);
                            XMLBuffer& fXsiNil = bbXsi.getBuffer();

                            DatatypeValidator* tempDV = DatatypeValidatorFactory::getBuiltInRegistry()->get(SchemaSymbols::fgDT_BOOLEAN);
                            normalizeAttRawValue(SchemaSymbols::fgATT_NILL, valuePtr, fXsiNil);
                            ((SchemaValidator*) fValidator)->normalizeWhiteSpace(tempDV, fXsiNil.getRawBuffer(), fXsiNil, true);
                            if(XMLString::equals(fXsiNil.getRawBuffer(), SchemaSymbols::fgATTVAL_TRUE))
                                ((SchemaValidator*)fValidator)->setNillable(true);
                            else if(XMLString::equals(fXsiNil.getRawBuffer(), SchemaSymbols::fgATTVAL_FALSE))
                                ((SchemaValidator*)fValidator)->setNillable(false);
                            else
                                emitError(XMLErrs::InvalidAttValue, fXsiNil.getRawBuffer(), valuePtr);
                        }
                    }
                }
            }
        }
    }

}